

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shlut.hpp
# Opt level: O2

void calculate_sh_lut(float *data,int size)

{
  float *pfVar1;
  ulong uVar2;
  int index;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  float *pfVar6;
  float *pfVar7;
  long lVar8;
  int face;
  long lVar9;
  uint in_XMM0_Db;
  uint uVar10;
  uint extraout_XMM0_Db;
  uint in_XMM0_Dc;
  uint uVar11;
  uint extraout_XMM0_Dc;
  uint in_XMM0_Dd;
  uint uVar12;
  uint extraout_XMM0_Dd;
  vec3f vVar13;
  float *local_490;
  vec3f d [6];
  vec3f local_408;
  float GU;
  float local_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  float local_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  float local_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  float coeffs [225];
  
  GU = (float)size * 0.5;
  local_3e8 = -GU;
  uStack_3e4 = in_XMM0_Db ^ 0x80000000;
  uStack_3e0 = in_XMM0_Dc ^ 0x80000000;
  uStack_3dc = in_XMM0_Dd ^ 0x80000000;
  lVar8 = (long)size;
  uVar2 = 0;
  uVar3 = 0;
  if (0 < size) {
    uVar3 = (ulong)(uint)size;
  }
  uStack_3c4 = in_XMM0_Db;
  uStack_3c0 = in_XMM0_Dc;
  uStack_3bc = in_XMM0_Dd;
  local_490 = data;
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    local_3c8 = ((float)(int)uVar2 - GU) + 0.5;
    local_3d8 = -local_3c8;
    uVar10 = uStack_3c4 ^ 0x80000000;
    uVar11 = uStack_3c0 ^ 0x80000000;
    uVar12 = uStack_3bc ^ 0x80000000;
    pfVar6 = local_490;
    uStack_3d4 = uVar10;
    uStack_3d0 = uVar11;
    uStack_3cc = uVar12;
    for (uVar5 = 0; uVar5 != (uint)size; uVar5 = uVar5 + 1) {
      d[1].z = ((float)(int)uVar5 - GU) + 0.5;
      d[0].z = -d[1].z;
      d[0].x = GU;
      d[0].y = local_3d8;
      d[1].x = local_3e8;
      d[1].y = local_3d8;
      d[2].y = GU;
      d[2].z = local_3c8;
      d[3].y = local_3e8;
      d[3].z = local_3d8;
      d[4].y = local_3d8;
      d[4].z = GU;
      d[5].y = local_3d8;
      d[5].z = local_3e8;
      pfVar7 = pfVar6;
      d[2].x = d[1].z;
      d[3].x = d[1].z;
      d[4].x = d[1].z;
      d[5].x = d[0].z;
      for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
        vVar13 = normalized(d + lVar9);
        local_408.z = vVar13.z;
        local_408._0_8_ = vVar13._0_8_;
        SHEvaluate(&local_408,0xe,coeffs);
        pfVar1 = pfVar7;
        uVar10 = extraout_XMM0_Db;
        uVar11 = extraout_XMM0_Dc;
        uVar12 = extraout_XMM0_Dd;
        for (lVar4 = 0; lVar4 != 0xe1; lVar4 = lVar4 + 1) {
          uVar10 = 0;
          uVar11 = 0;
          uVar12 = 0;
          *pfVar1 = coeffs[lVar4];
          pfVar1 = pfVar1 + lVar8 * lVar8 * 6;
        }
        pfVar7 = pfVar7 + lVar8 * lVar8;
      }
      pfVar6 = pfVar6 + 1;
    }
    local_490 = local_490 + lVar8;
    uStack_3c4 = uVar10;
    uStack_3c0 = uVar11;
    uStack_3bc = uVar12;
  }
  return;
}

Assistant:

void calculate_sh_lut(float* data, const int size)
// layout: SHindex, face, position, rgb
{
	// evaluate SH bases at different direction N
	for (int i = 0; i < size; i++)
	{
		for (int j = 0; j < size; j++)
		{
			float GU = size*0.5f;
			float u = (float)j - GU + 0.5f;
			float v = (float)i - GU + 0.5f;
			// corresponding direction on each face
			vec3f d[6] = {
				vec3f( GU,  -v,  -u),
				vec3f(-GU,  -v,   u),
				vec3f(  u,  GU,   v),
				vec3f(  u, -GU,  -v),
				vec3f(  u,  -v,  GU),
				vec3f( -u,  -v, -GU)
			};
			for (int face = 0; face < 6; face++)
			{
				float coeffs[N_COEFFS];
				vec3f N = normalized(d[face]);
				SHEvaluate(N, shorder-1, coeffs);
				// fill in data
				for(int index=0; index < N_COEFFS; ++index) {
					data[((index*6 + face) * size + i) * size + j] = coeffs[index];
				}
			}
		}
	}
}